

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O2

bool __thiscall leveldb::log::Reader::ReadRecord(Reader *this,Slice *record,string *scratch)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  char *reason;
  size_type sVar5;
  uint64_t uVar6;
  Slice fragment;
  uint64_t local_60;
  char buf [40];
  
  if ((this->last_record_offset_ < this->initial_offset_) &&
     (bVar3 = SkipToInitialBlock(this), !bVar3)) {
    return false;
  }
  scratch->_M_string_length = 0;
  *(scratch->_M_dataplus)._M_p = '\0';
  record->data_ = "";
  record->size_ = 0;
  fragment.data_ = "";
  fragment.size_ = 0;
  bVar3 = false;
  local_60 = 0;
LAB_0010e031:
  uVar4 = ReadPhysicalRecord(this,&fragment);
  sVar2 = fragment.size_;
  sVar1 = (this->buffer_).size_;
  if (this->resyncing_ == true) goto code_r0x0010e053;
  goto LAB_0010e069;
code_r0x0010e053:
  if (uVar4 != 3) {
    if (uVar4 != 4) {
      this->resyncing_ = false;
LAB_0010e069:
      if (uVar4 - 1 < 6) {
        uVar6 = (this->end_of_buffer_offset_ - (sVar1 + fragment.size_)) - 7;
        switch(uVar4) {
        case 1:
          if ((bVar3) && (scratch->_M_string_length != 0)) {
            ReportCorruption(this,scratch->_M_string_length,"partial record without end(1)");
          }
          scratch->_M_string_length = 0;
          *(scratch->_M_dataplus)._M_p = '\0';
          record->data_ = fragment.data_;
          record->size_ = fragment.size_;
          this->last_record_offset_ = uVar6;
          return true;
        case 2:
          if ((bVar3) && (scratch->_M_string_length != 0)) {
            ReportCorruption(this,scratch->_M_string_length,"partial record without end(2)");
          }
          std::__cxx11::string::assign((char *)scratch,(ulong)fragment.data_);
          bVar3 = true;
          local_60 = uVar6;
          goto LAB_0010e031;
        case 3:
          if (bVar3) {
            std::__cxx11::string::append((char *)scratch,(ulong)fragment.data_);
          }
          else {
            ReportCorruption(this,fragment.size_,"missing start of fragmented record(1)");
          }
          goto LAB_0010e031;
        case 4:
          if (bVar3) {
            std::__cxx11::string::append((char *)scratch,(ulong)fragment.data_);
            sVar5 = scratch->_M_string_length;
            record->data_ = (scratch->_M_dataplus)._M_p;
            record->size_ = sVar5;
            this->last_record_offset_ = local_60;
            return true;
          }
          ReportCorruption(this,fragment.size_,"missing start of fragmented record(2)");
          goto LAB_0010e031;
        case 5:
          if (!bVar3) {
            return false;
          }
          scratch->_M_string_length = 0;
          *(scratch->_M_dataplus)._M_p = '\0';
          return false;
        }
        if (!bVar3) goto LAB_0010e031;
        sVar5 = scratch->_M_string_length;
        reason = "error in middle of record";
      }
      else {
        snprintf(buf,0x28,"unknown record type %u",(ulong)uVar4);
        if (bVar3) {
          sVar5 = scratch->_M_string_length;
        }
        else {
          sVar5 = 0;
        }
        sVar5 = sVar5 + sVar2;
        reason = buf;
      }
      ReportCorruption(this,sVar5,reason);
      scratch->_M_string_length = 0;
      *(scratch->_M_dataplus)._M_p = '\0';
      bVar3 = false;
      goto LAB_0010e031;
    }
    this->resyncing_ = false;
  }
  goto LAB_0010e031;
}

Assistant:

bool Reader::ReadRecord(Slice *record, std::string *scratch) {
            if (last_record_offset_ < initial_offset_) {
                if (!SkipToInitialBlock()) {
                    return false;
                }
            }

            scratch->clear();
            record->clear();
            bool in_fragmented_record = false;
            // Record offset of the logical record that we're reading
            // 0 is a dummy value to make compilers happy
            uint64_t prospective_record_offset = 0;

            Slice fragment;
            while (true) {
                const unsigned int record_type = ReadPhysicalRecord(&fragment);

                // ReadPhysicalRecord may have only had an empty trailer remaining in its
                // internal buffer. Calculate the offset of the next physical record now
                // that it has returned, properly accounting for its header size.
                uint64_t physical_record_offset =
                        end_of_buffer_offset_ - buffer_.size() - kHeaderSize - fragment.size();

                if (resyncing_) {
                    if (record_type == kMiddleType) {
                        continue;
                    } else if (record_type == kLastType) {
                        resyncing_ = false;
                        continue;
                    } else {
                        resyncing_ = false;
                    }
                }

                switch (record_type) {
                    case kFullType:
                        if (in_fragmented_record) {
                            // Handle bug in earlier versions of log::Writer where
                            // it could emit an empty kFirstType record at the tail end
                            // of a block followed by a kFullType or kFirstType record
                            // at the beginning of the next block.
                            if (scratch->empty()) {
                                in_fragmented_record = false;
                            } else {
                                ReportCorruption(scratch->size(), "partial record without end(1)");
                            }
                        }
                        prospective_record_offset = physical_record_offset;
                        scratch->clear();
                        *record = fragment;
                        last_record_offset_ = prospective_record_offset;
                        return true;

                    case kFirstType:
                        if (in_fragmented_record) {
                            // Handle bug in earlier versions of log::Writer where
                            // it could emit an empty kFirstType record at the tail end
                            // of a block followed by a kFullType or kFirstType record
                            // at the beginning of the next block.
                            if (scratch->empty()) {
                                in_fragmented_record = false;
                            } else {
                                ReportCorruption(scratch->size(), "partial record without end(2)");
                            }
                        }
                        prospective_record_offset = physical_record_offset;
                        scratch->assign(fragment.data(), fragment.size());
                        in_fragmented_record = true;
                        break;

                    case kMiddleType:
                        if (!in_fragmented_record) {
                            ReportCorruption(fragment.size(),
                                             "missing start of fragmented record(1)");
                        } else {
                            scratch->append(fragment.data(), fragment.size());
                        }
                        break;

                    case kLastType:
                        if (!in_fragmented_record) {
                            ReportCorruption(fragment.size(),
                                             "missing start of fragmented record(2)");
                        } else {
                            scratch->append(fragment.data(), fragment.size());
                            *record = Slice(*scratch);
                            last_record_offset_ = prospective_record_offset;
                            return true;
                        }
                        break;

                    case kEof:
                        if (in_fragmented_record) {
                            // This can be caused by the writer dying immediately after
                            // writing a physical record but before completing the next; don't
                            // treat it as a corruption, just ignore the entire logical record.
                            scratch->clear();
                        }
                        return false;

                    case kBadRecord:
                        if (in_fragmented_record) {
                            ReportCorruption(scratch->size(), "error in middle of record");
                            in_fragmented_record = false;
                            scratch->clear();
                        }
                        break;

                    default: {
                        char buf[40];
                        snprintf(buf, sizeof(buf), "unknown record type %u", record_type);
                        ReportCorruption(
                                (fragment.size() + (in_fragmented_record ? scratch->size() : 0)),
                                buf);
                        in_fragmented_record = false;
                        scratch->clear();
                        break;
                    }
                }
            }
            return false;
        }